

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cont_mgau.c
# Opt level: O0

int32 mgau_precomp(mgau_model_t *g)

{
  int iVar1;
  float64 __x;
  double dVar2;
  double local_28;
  float64 lrd;
  int local_18;
  int32 i;
  int32 c;
  int32 m;
  mgau_model_t *g_local;
  
  if (g->verbose != 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
            ,0x362,"Precomputing Mahalanobis distance invariants\n");
  }
  i = 0;
  do {
    if (g->n_mgau <= i) {
      return 0;
    }
    for (local_18 = 0; local_18 < g->mgau[i].n_comp; local_18 = local_18 + 1) {
      if (g->mgau[i].fullvar == (float32 ***)0x0) {
        local_28 = 0.0;
        for (lrd._4_4_ = 0; lrd._4_4_ < g->veclen; lrd._4_4_ = lrd._4_4_ + 1) {
          dVar2 = log((double)(float)g->mgau[i].var[local_18][lrd._4_4_]);
          local_28 = dVar2 + local_28;
          g->mgau[i].var[local_18][lrd._4_4_] =
               (float32)(1.0 / ((float)g->mgau[i].var[local_18][lrd._4_4_] * 2.0));
        }
      }
      else {
        __x = determinant(g->mgau[i].fullvar[local_18],g->veclen);
        if ((double)__x <= 0.0) {
          __assert_fail("lrd > 0.0",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                        ,0x36b,"int32 mgau_precomp(mgau_model_t *)");
        }
        local_28 = log((double)__x);
        invert(g->mgau[i].fullvar[local_18],g->mgau[i].fullvar[local_18],g->veclen);
      }
      iVar1 = g->veclen;
      dVar2 = log(6.283185307179586);
      g->mgau[i].lrd[local_18] = (float32)(float)(((double)iVar1 * dVar2 + local_28) * -0.5);
    }
    i = i + 1;
  } while( true );
}

Assistant:

int32
mgau_precomp(mgau_model_t * g)
{
    int32 m, c, i;
    float64 lrd;

    if (g->verbose)
        E_INFO("Precomputing Mahalanobis distance invariants\n");

    for (m = 0; m < mgau_n_mgau(g); m++) {
        for (c = 0; c < mgau_n_comp(g, m); c++) {
            if (g->mgau[m].fullvar) {
                lrd = determinant(g->mgau[m].fullvar[c], mgau_veclen(g));
                /* E_INFO("covariance mgau %d comp %d determinant = %g\n",
                   m, c, lrd); */
                /* Shouldn't happen, since we removed them earlier */
                assert(lrd > 0.0);
                lrd = log(lrd);
                invert(g->mgau[m].fullvar[c], g->mgau[m].fullvar[c],
                       mgau_veclen(g));
                /* Not doubling it here. */
            }
            else {
                lrd = 0.0;
                for (i = 0; i < mgau_veclen(g); i++) {
                    lrd += log(g->mgau[m].var[c][i]);

                    /* Precompute this part of the exponential */
                    g->mgau[m].var[c][i] =
                        (float32) (1.0 / (g->mgau[m].var[c][i] * 2.0));
                }
            }
            lrd += mgau_veclen(g) * log(2.0 * M_PI);      /* (2pi)^velen */
            mgau_lrd(g, m, c) = (float32) (-0.5 * lrd); /* Reciprocal, sqrt */
        }
    }

    return 0;
}